

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

PolicyPureVector * __thiscall
PolicyPureVector::operator=(PolicyPureVector *this,PolicyPureVector *o)

{
  if (this != o) {
    PolicyDiscrete::operator=((PolicyDiscrete *)this,(PolicyDiscrete *)o);
    *(undefined4 *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34 =
         *(undefined4 *)&(o->super_PolicyDiscretePure).super_PolicyDiscrete.field_0x34;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_m_domainToActionIndices,&o->_m_domainToActionIndices);
  }
  return this;
}

Assistant:

PolicyPureVector& PolicyPureVector::operator= (const PolicyPureVector& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    PolicyDiscretePure::operator= ( o );
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices = o._m_domainToActionIndices;

    return *this;
}